

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

bool Js::JavascriptRegExp::HasObservableUnicodeFlag(DynamicObject *regexPrototype)

{
  bool bVar1;
  int index;
  ScriptContext *this;
  ScriptConfiguration *this_00;
  JavascriptLibrary *this_01;
  JavascriptFunction *pJVar2;
  JavascriptFunction *pJVar3;
  undefined1 local_21;
  JavascriptLibrary *library;
  ScriptConfiguration *scriptConfig;
  DynamicObject *regexPrototype_local;
  
  this = RecyclableObject::GetScriptContext(&regexPrototype->super_RecyclableObject);
  this_00 = ScriptContext::GetConfig(this);
  this_01 = RecyclableObject::GetLibrary(&regexPrototype->super_RecyclableObject);
  bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
  local_21 = false;
  if (bVar1) {
    bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_00);
    local_21 = false;
    if (bVar1) {
      index = JavascriptLibrary::GetRegexUnicodeGetterSlotIndex(this_01);
      pJVar2 = (JavascriptFunction *)DynamicObject::GetSlot(regexPrototype,index);
      pJVar3 = JavascriptLibrary::GetRegexUnicodeGetterFunction(this_01);
      local_21 = pJVar2 != pJVar3;
    }
  }
  return local_21;
}

Assistant:

bool JavascriptRegExp::HasObservableUnicodeFlag(DynamicObject* regexPrototype)
    {
        const ScriptConfiguration* scriptConfig = regexPrototype->GetScriptContext()->GetConfig();
        JavascriptLibrary* library = regexPrototype->GetLibrary();
        return scriptConfig->IsES6UnicodeExtensionsEnabled()
            && scriptConfig->IsES6RegExPrototypePropertiesEnabled()
            && regexPrototype->GetSlot(library->GetRegexUnicodeGetterSlotIndex()) != library->GetRegexUnicodeGetterFunction();
    }